

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_modmul(mp_int *x,mp_int *y,mp_int *modulus)

{
  mp_int *r;
  mp_int *r_out;
  
  r = mp_make_sized(y->nw + x->nw);
  mp_mul_into(r,x,y);
  r_out = mp_make_sized(modulus->nw);
  mp_divmod_into(r,modulus,(mp_int *)0x0,r_out);
  mp_free(r);
  return r_out;
}

Assistant:

mp_int *mp_modmul(mp_int *x, mp_int *y, mp_int *modulus)
{
    mp_int *product = mp_mul(x, y);
    mp_int *reduced = mp_mod(product, modulus);
    mp_free(product);
    return reduced;
}